

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformDefinitions
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  ostream *poVar1;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8;
  GLuint local_2c;
  string *psStack_28;
  GLuint n_uniforms;
  string *out_source_code_local;
  uniformTypeDetails *uniform_type_local;
  GPUShaderFP64Test2 *pGStack_10;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  psStack_28 = out_source_code;
  out_source_code_local = (string *)uniform_type;
  uniform_type_local._4_4_ = shader_stage;
  pGStack_10 = this;
  local_2c = getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(&local_1a8,"layout(std140) uniform ");
  poVar1 = std::operator<<(poVar1,m_uniform_block_name);
  std::operator<<(poVar1,"\n{\n");
  poVar1 = std::operator<<(&local_1a8,"    ");
  poVar1 = std::operator<<(poVar1,(string *)(out_source_code_local->field_2)._M_local_buf);
  poVar1 = std::operator<<(poVar1," uniform_array[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  std::operator<<(poVar1,"];\n");
  std::operator<<(&local_1a8,"};\n\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)psStack_28,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformDefinitions(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
												   std::string& out_source_code) const
{
	const glw::GLuint n_uniforms = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * layout(std140) uniform M_UNIFORM_BLOCK_NAME
	 * {
	 *     TYPE_NAME uniform_array[N_UNIFORMS];
	 * };
	 */
	stream << "layout(std140) uniform " << m_uniform_block_name << "\n"
																   "{\n";

	stream << "    " << uniform_type.m_type_name << " uniform_array[" << n_uniforms << "];\n";

	stream << "};\n\n";

	out_source_code = stream.str();
}